

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip38.c
# Opt level: O0

void aes_enc_impl(uchar *src,uchar *xor,uchar *key,uchar *bytes_out)

{
  ulong local_40;
  size_t i;
  uchar plaintext [16];
  uchar *bytes_out_local;
  uchar *key_local;
  uchar *xor_local;
  uchar *src_local;
  
  for (local_40 = 0; local_40 < 0x10; local_40 = local_40 + 1) {
    plaintext[local_40 - 8] = src[local_40] ^ xor[local_40];
  }
  plaintext._8_8_ = bytes_out;
  wally_aes(key,0x20,(uchar *)&i,0x10,1,bytes_out,0x10);
  wally_clear(&i,0x10);
  return;
}

Assistant:

static void aes_enc_impl(const unsigned char *src, const unsigned char *xor,
                         const unsigned char *key, unsigned char *bytes_out)
{
    unsigned char plaintext[AES_BLOCK_LEN];
    size_t i;

    for (i = 0; i < sizeof(plaintext); ++i)
        plaintext[i] = src[i] ^ xor[i];

    wally_aes(key, AES_KEY_LEN_256, plaintext, AES_BLOCK_LEN,
              AES_FLAG_ENCRYPT, bytes_out, AES_BLOCK_LEN);

    wally_clear(plaintext, sizeof(plaintext));
}